

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

void __thiscall
QMainWindowLayout::applyState(QMainWindowLayout *this,QMainWindowLayoutState *newState,bool animate)

{
  QMainWindowLayout QVar1;
  ulong uVar2;
  int iVar3;
  QWidget *pQVar4;
  long lVar5;
  QHash<QTabBar_*,_QHashDummyValue> QVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  QHash<QWidget_*,_QHashDummyValue> QVar10;
  long in_FS_OFFSET;
  QSet<QWidget_*> retiredSeps;
  QSet<QWidget_*> usedSeps;
  QSet<QTabBar_*> retired;
  QList<QDockWidgetGroupWindow_*> list;
  QSet<QTabBar_*> used;
  QHash<QWidget_*,_QHashDummyValue> local_80;
  undefined1 local_78 [8];
  QHash<QTabBar_*,_QHashDummyValue> local_70;
  QArrayData *local_68;
  long lStack_60;
  QLayoutItem *local_58;
  undefined1 local_48 [8];
  QWidget *local_40;
  Data *local_38;
  
  local_38 = *(Data **)(in_FS_OFFSET + 0x28);
  if (this[0x800] != (QMainWindowLayout)0x0) goto LAB_0043cdea;
  this[0x800] = (QMainWindowLayout)0x1;
  local_48 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QDockAreaLayout::usedTabBars((QDockAreaLayout *)local_48);
  local_68 = (QArrayData *)0x0;
  lStack_60 = 0;
  local_58 = (QLayoutItem *)0x0;
  qt_qFindChildren_helper
            (*(undefined8 *)(*(long *)(this + 8) + 0x10),0,0,
             &QDockWidgetGroupWindow::staticMetaObject,&local_68,0);
  lVar7 = lStack_60;
  if (local_58 != (QLayoutItem *)0x0) {
    lVar8 = (long)local_58 << 3;
    lVar5 = 0;
    do {
      QWidget::layout(*(QWidget **)(lVar7 + lVar5));
      QDockAreaLayoutInfo::usedTabBars((QDockAreaLayoutInfo *)&stack0xffffffffffffffc0);
      QSet<QTabBar_*>::unite
                ((QSet<QTabBar_*> *)local_48,(QSet<QTabBar_*> *)&stack0xffffffffffffffc0);
      QHash<QTabBar_*,_QHashDummyValue>::~QHash
                ((QHash<QTabBar_*,_QHashDummyValue> *)&stack0xffffffffffffffc0);
      lVar5 = lVar5 + 8;
    } while (lVar8 != lVar5);
  }
  local_70.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  operator-((QSet<QTabBar_*> *)&local_70,(QSet<QTabBar_*> *)(this + 0x718));
  QHash<QTabBar_*,_QHashDummyValue>::operator=
            ((QHash<QTabBar_*,_QHashDummyValue> *)(this + 0x718),
             (QHash<QTabBar_*,_QHashDummyValue> *)local_48);
  if (local_70.d == (Data *)0x0) {
    QVar6.d = (Data *)0x0;
LAB_0043cb17:
    uVar9 = 0;
  }
  else {
    QVar6.d = local_70.d;
    if ((local_70.d)->spans->offsets[0] != 0xff) goto LAB_0043cb17;
    uVar2 = 1;
    do {
      uVar9 = uVar2;
      if ((local_70.d)->numBuckets == uVar9) {
        QVar6.d = (Data *)0x0;
        uVar9 = 0;
        break;
      }
      uVar2 = uVar9 + 1;
    } while ((local_70.d)->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
  }
  if (QVar6.d != (Data *)0x0 || uVar9 != 0) {
    do {
      pQVar4 = *(QWidget **)
                (QVar6.d)->spans[uVar9 >> 7].entries
                [(QVar6.d)->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f]].storage.data;
      QWidget::hide(pQVar4);
      while (iVar3 = QTabBar::count((QTabBar *)pQVar4), 0 < iVar3) {
        QTabBar::removeTab((QTabBar *)pQVar4,0);
      }
      local_40 = pQVar4;
      QtPrivate::QPodArrayOps<QTabBar*>::emplace<QTabBar*&>
                ((QPodArrayOps<QTabBar*> *)(this + 0x720),*(qsizetype *)(this + 0x730),
                 (QTabBar **)&stack0xffffffffffffffc0);
      QList<QTabBar_*>::end((QList<QTabBar_*> *)(this + 0x720));
      do {
        if ((QVar6.d)->numBuckets - 1 == uVar9) {
          QVar6.d = (Data *)0x0;
          uVar9 = 0;
          break;
        }
        uVar9 = uVar9 + 1;
      } while ((QVar6.d)->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
    } while ((QVar6.d != (Data *)0x0) || (uVar9 != 0));
  }
  if (*(int *)(this + 0x760) == 1) {
    local_78 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    QDockAreaLayout::usedSeparatorWidgets((QDockAreaLayout *)local_78);
    local_80.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    operator-((QSet<QWidget_*> *)&local_80,(QSet<QWidget_*> *)(this + 0x740));
    QHash<QWidget_*,_QHashDummyValue>::operator=
              ((QHash<QWidget_*,_QHashDummyValue> *)(this + 0x740),
               (QHash<QWidget_*,_QHashDummyValue> *)local_78);
    if (local_80.d == (Data *)0x0) {
      QVar10.d = (Data *)0x0;
LAB_0043cc8b:
      uVar9 = 0;
    }
    else {
      QVar10.d = local_80.d;
      if ((local_80.d)->spans->offsets[0] != 0xff) goto LAB_0043cc8b;
      uVar2 = 1;
      do {
        uVar9 = uVar2;
        if ((local_80.d)->numBuckets == uVar9) {
          uVar9 = 0;
          QVar10.d = (Data *)0x0;
          break;
        }
        uVar2 = uVar9 + 1;
      } while ((local_80.d)->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
    }
    if (QVar10.d != (Data *)0x0 || uVar9 != 0) {
      do {
        pQVar4 = *(QWidget **)
                  (QVar10.d)->spans[uVar9 >> 7].entries
                  [(QVar10.d)->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f]].storage.data;
        local_40 = pQVar4;
        QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
                  ((QPodArrayOps<QWidget*> *)(this + 0x748),*(qsizetype *)(this + 0x758),
                   &stack0xffffffffffffffc0);
        QList<QWidget_*>::end((QList<QWidget_*> *)(this + 0x748));
        QWidget::hide(pQVar4);
        do {
          if ((QVar10.d)->numBuckets - 1 == uVar9) {
            QVar10.d = (Data *)0x0;
            uVar9 = 0;
            break;
          }
          uVar9 = uVar9 + 1;
        } while ((QVar10.d)->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
      } while ((QVar10.d != (Data *)0x0) || (uVar9 != 0));
    }
    QHash<QWidget_*,_QHashDummyValue>::~QHash(&local_80);
    QHash<QWidget_*,_QHashDummyValue>::~QHash((QHash<QWidget_*,_QHashDummyValue> *)local_78);
  }
  lVar7 = 0;
  do {
    pQVar4 = QLayout::parentWidget((QLayout *)this);
    QDockAreaLayoutInfo::reparentWidgets
              ((QDockAreaLayoutInfo *)((long)&(newState->dockAreaLayout).docks[0].sep + lVar7),
               pQVar4);
    lVar7 = lVar7 + 0x70;
  } while (lVar7 != 0x1c0);
  QVar1 = this[0x700];
  QToolBarAreaLayout::apply(&newState->toolBarAreaLayout,(bool)(animate & (byte)QVar1));
  QDockAreaLayout::apply(&newState->dockAreaLayout,(bool)(animate & (byte)QVar1));
  this[0x800] = (QMainWindowLayout)0x0;
  QHash<QTabBar_*,_QHashDummyValue>::~QHash(&local_70);
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,8,0x10);
    }
  }
  QHash<QTabBar_*,_QHashDummyValue>::~QHash((QHash<QTabBar_*,_QHashDummyValue> *)local_48);
LAB_0043cdea:
  if (*(Data **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMainWindowLayout::applyState(QMainWindowLayoutState &newState, bool animate)
{
    // applying the state can lead to showing separator widgets, which would lead to a re-layout
    // (even though the separator widgets are not really part of the layout)
    // break the loop
    if (isInApplyState)
        return;
    isInApplyState = true;
#if QT_CONFIG(dockwidget) && QT_CONFIG(tabwidget)
    QSet<QTabBar*> used = newState.dockAreaLayout.usedTabBars();
    const auto groups =
            parent()->findChildren<QDockWidgetGroupWindow*>(Qt::FindDirectChildrenOnly);
    for (QDockWidgetGroupWindow *dwgw : groups)
        used += dwgw->layoutInfo()->usedTabBars();

    const QSet<QTabBar*> retired = usedTabBars - used;
    usedTabBars = used;
    for (QTabBar *tab_bar : retired) {
        tab_bar->hide();
        while (tab_bar->count() > 0)
            tab_bar->removeTab(0);
        unusedTabBars.append(tab_bar);
    }

    if (sep == 1) {
        const QSet<QWidget*> usedSeps = newState.dockAreaLayout.usedSeparatorWidgets();
        const QSet<QWidget*> retiredSeps = usedSeparatorWidgets - usedSeps;
        usedSeparatorWidgets = usedSeps;
        for (QWidget *sepWidget : retiredSeps) {
            unusedSeparatorWidgets.append(sepWidget);
            sepWidget->hide();
        }
    }

    for (int i = 0; i < QInternal::DockCount; ++i)
        newState.dockAreaLayout.docks[i].reparentWidgets(parentWidget());

#endif // QT_CONFIG(dockwidget) && QT_CONFIG(tabwidget)
    newState.apply(dockOptions & QMainWindow::AnimatedDocks && animate);
    isInApplyState = false;
}